

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O0

void vkt::shaderexecutor::anon_unknown_0::GeometryShaderExecutor::generateSources
               (ShaderSpec *shaderSpec,SourceCollections *programCollection)

{
  size_t sVar1;
  ProgramSources *pPVar2;
  char *in_R8;
  allocator<char> local_259;
  string local_258;
  allocator<char> local_231;
  string local_230;
  string local_210;
  ShaderSource local_1f0;
  allocator<char> local_1c1;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  allocator<char> local_171;
  string local_170;
  string local_150;
  ShaderSource local_130;
  allocator<char> local_101;
  string local_100;
  string local_e0;
  ShaderSource local_c0;
  allocator<char> local_81;
  string local_80;
  undefined1 local_60 [8];
  FragmentOutputLayout outputLayout;
  SourceCollections *programCollection_local;
  ShaderSpec *shaderSpec_local;
  
  outputLayout.locationMap._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)programCollection;
  computeFragmentOutputLayout((FragmentOutputLayout *)local_60,&shaderSpec->outputs);
  sVar1 = outputLayout.locationMap._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"vert",&local_81);
  pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     ((ProgramCollection<glu::ProgramSources> *)sVar1,&local_80);
  shaderexecutor::(anonymous_namespace)::generatePassthroughVertexShader_abi_cxx11_
            (&local_e0,(_anonymous_namespace_ *)shaderSpec,
             (vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_> *)
             0x12bdc65,"vtx_out_",in_R8);
  glu::VertexSource::VertexSource((VertexSource *)&local_c0,&local_e0);
  glu::ProgramSources::operator<<(pPVar2,&local_c0);
  glu::VertexSource::~VertexSource((VertexSource *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  sVar1 = outputLayout.locationMap._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"geom",&local_101);
  pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     ((ProgramCollection<glu::ProgramSources> *)sVar1,&local_100);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"vtx_out_",&local_171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"geom_out_",&local_199);
  generateGeometryShader(&local_150,shaderSpec,&local_170,&local_198);
  glu::GeometrySource::GeometrySource((GeometrySource *)&local_130,&local_150);
  glu::ProgramSources::operator<<(pPVar2,&local_130);
  glu::GeometrySource::~GeometrySource((GeometrySource *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  sVar1 = outputLayout.locationMap._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"frag",&local_1c1);
  pPVar2 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     ((ProgramCollection<glu::ProgramSources> *)sVar1,&local_1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"geom_out_",&local_231);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"o_",&local_259);
  generatePassthroughFragmentShader
            (&local_210,shaderSpec,false,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)&outputLayout.locationSymbols.
                 super__Vector_base<const_vkt::shaderexecutor::Symbol_*,_std::allocator<const_vkt::shaderexecutor::Symbol_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_230,&local_258);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_1f0,&local_210);
  glu::ProgramSources::operator<<(pPVar2,&local_1f0);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  FragmentOutputLayout::~FragmentOutputLayout((FragmentOutputLayout *)local_60);
  return;
}

Assistant:

void GeometryShaderExecutor::generateSources (const ShaderSpec& shaderSpec, SourceCollections& programCollection)
{
	const FragmentOutputLayout	outputLayout	(computeFragmentOutputLayout(shaderSpec.outputs));

	programCollection.glslSources.add("vert") << glu::VertexSource(generatePassthroughVertexShader(shaderSpec.inputs, "a_", "vtx_out_"));

	programCollection.glslSources.add("geom") << glu::GeometrySource(generateGeometryShader(shaderSpec, "vtx_out_", "geom_out_"));

	/* \todo [2015-09-18 rsipka] set useIntOutputs parameter if needed. */
	programCollection.glslSources.add("frag") << glu::FragmentSource(generatePassthroughFragmentShader(shaderSpec, false, outputLayout.locationMap, "geom_out_", "o_"));

}